

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O0

void tcu::anon_unknown_0::decompressBlock
               (CompressedTexFormat format,PixelBufferAccess *dst,deUint8 *src,
               TexDecompressionParams *params)

{
  TexDecompressionParams *params_local;
  deUint8 *src_local;
  PixelBufferAccess *dst_local;
  CompressedTexFormat format_local;
  
  switch(format) {
  case COMPRESSEDTEXFORMAT_ETC1_RGB8:
    decompressETC1(dst,src);
    break;
  case COMPRESSEDTEXFORMAT_EAC_R11:
    decompressEAC_R11(dst,src,false);
    break;
  case COMPRESSEDTEXFORMAT_EAC_SIGNED_R11:
    decompressEAC_R11(dst,src,true);
    break;
  case COMPRESSEDTEXFORMAT_EAC_RG11:
    decompressEAC_RG11(dst,src,false);
    break;
  case COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11:
    decompressEAC_RG11(dst,src,true);
    break;
  case COMPRESSEDTEXFORMAT_ETC2_RGB8:
    decompressETC2(dst,src);
    break;
  case COMPRESSEDTEXFORMAT_ETC2_SRGB8:
    decompressETC2(dst,src);
    break;
  case COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1:
    decompressETC2_RGB8_PUNCHTHROUGH_ALPHA1(dst,src);
    break;
  case COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1:
    decompressETC2_RGB8_PUNCHTHROUGH_ALPHA1(dst,src);
    break;
  case COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8:
    decompressETC2_EAC_RGBA8(dst,src);
    break;
  case COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8:
    decompressETC2_EAC_RGBA8(dst,src);
    break;
  case COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA:
  case COMPRESSEDTEXFORMAT_ASTC_5x4_RGBA:
  case COMPRESSEDTEXFORMAT_ASTC_5x5_RGBA:
  case COMPRESSEDTEXFORMAT_ASTC_6x5_RGBA:
  case COMPRESSEDTEXFORMAT_ASTC_6x6_RGBA:
  case COMPRESSEDTEXFORMAT_ASTC_8x5_RGBA:
  case COMPRESSEDTEXFORMAT_ASTC_8x6_RGBA:
  case COMPRESSEDTEXFORMAT_ASTC_8x8_RGBA:
  case COMPRESSEDTEXFORMAT_ASTC_10x5_RGBA:
  case COMPRESSEDTEXFORMAT_ASTC_10x6_RGBA:
  case COMPRESSEDTEXFORMAT_ASTC_10x8_RGBA:
  case COMPRESSEDTEXFORMAT_ASTC_10x10_RGBA:
  case COMPRESSEDTEXFORMAT_ASTC_12x10_RGBA:
  case COMPRESSEDTEXFORMAT_ASTC_12x12_RGBA:
  case COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8:
  case COMPRESSEDTEXFORMAT_ASTC_5x4_SRGB8_ALPHA8:
  case COMPRESSEDTEXFORMAT_ASTC_5x5_SRGB8_ALPHA8:
  case COMPRESSEDTEXFORMAT_ASTC_6x5_SRGB8_ALPHA8:
  case COMPRESSEDTEXFORMAT_ASTC_6x6_SRGB8_ALPHA8:
  case COMPRESSEDTEXFORMAT_ASTC_8x5_SRGB8_ALPHA8:
  case COMPRESSEDTEXFORMAT_ASTC_8x6_SRGB8_ALPHA8:
  case COMPRESSEDTEXFORMAT_ASTC_8x8_SRGB8_ALPHA8:
  case COMPRESSEDTEXFORMAT_ASTC_10x5_SRGB8_ALPHA8:
  case COMPRESSEDTEXFORMAT_ASTC_10x6_SRGB8_ALPHA8:
  case COMPRESSEDTEXFORMAT_ASTC_10x8_SRGB8_ALPHA8:
  case COMPRESSEDTEXFORMAT_ASTC_10x10_SRGB8_ALPHA8:
  case COMPRESSEDTEXFORMAT_ASTC_12x10_SRGB8_ALPHA8:
  case COMPRESSEDTEXFORMAT_ASTC_12x12_SRGB8_ALPHA8:
    astc::decompress(dst,src,format,params->astcMode);
  }
  return;
}

Assistant:

void decompressBlock (CompressedTexFormat format, const PixelBufferAccess& dst, const deUint8* src, const TexDecompressionParams& params)
{
	// No 3D blocks supported right now
	DE_ASSERT(dst.getDepth() == 1);

	switch (format)
	{
		case COMPRESSEDTEXFORMAT_ETC1_RGB8:							decompressETC1							(dst, src);			break;
		case COMPRESSEDTEXFORMAT_EAC_R11:							decompressEAC_R11						(dst, src, false);	break;
		case COMPRESSEDTEXFORMAT_EAC_SIGNED_R11:					decompressEAC_R11						(dst, src, true);	break;
		case COMPRESSEDTEXFORMAT_EAC_RG11:							decompressEAC_RG11						(dst, src, false);	break;
		case COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11:					decompressEAC_RG11						(dst, src, true);	break;
		case COMPRESSEDTEXFORMAT_ETC2_RGB8:							decompressETC2							(dst, src);			break;
		case COMPRESSEDTEXFORMAT_ETC2_SRGB8:						decompressETC2							(dst, src);			break;
		case COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1:		decompressETC2_RGB8_PUNCHTHROUGH_ALPHA1	(dst, src);			break;
		case COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1:	decompressETC2_RGB8_PUNCHTHROUGH_ALPHA1	(dst, src);			break;
		case COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8:					decompressETC2_EAC_RGBA8				(dst, src);			break;
		case COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8:				decompressETC2_EAC_RGBA8				(dst, src);			break;

		case COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA:
		case COMPRESSEDTEXFORMAT_ASTC_5x4_RGBA:
		case COMPRESSEDTEXFORMAT_ASTC_5x5_RGBA:
		case COMPRESSEDTEXFORMAT_ASTC_6x5_RGBA:
		case COMPRESSEDTEXFORMAT_ASTC_6x6_RGBA:
		case COMPRESSEDTEXFORMAT_ASTC_8x5_RGBA:
		case COMPRESSEDTEXFORMAT_ASTC_8x6_RGBA:
		case COMPRESSEDTEXFORMAT_ASTC_8x8_RGBA:
		case COMPRESSEDTEXFORMAT_ASTC_10x5_RGBA:
		case COMPRESSEDTEXFORMAT_ASTC_10x6_RGBA:
		case COMPRESSEDTEXFORMAT_ASTC_10x8_RGBA:
		case COMPRESSEDTEXFORMAT_ASTC_10x10_RGBA:
		case COMPRESSEDTEXFORMAT_ASTC_12x10_RGBA:
		case COMPRESSEDTEXFORMAT_ASTC_12x12_RGBA:
		case COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8:
		case COMPRESSEDTEXFORMAT_ASTC_5x4_SRGB8_ALPHA8:
		case COMPRESSEDTEXFORMAT_ASTC_5x5_SRGB8_ALPHA8:
		case COMPRESSEDTEXFORMAT_ASTC_6x5_SRGB8_ALPHA8:
		case COMPRESSEDTEXFORMAT_ASTC_6x6_SRGB8_ALPHA8:
		case COMPRESSEDTEXFORMAT_ASTC_8x5_SRGB8_ALPHA8:
		case COMPRESSEDTEXFORMAT_ASTC_8x6_SRGB8_ALPHA8:
		case COMPRESSEDTEXFORMAT_ASTC_8x8_SRGB8_ALPHA8:
		case COMPRESSEDTEXFORMAT_ASTC_10x5_SRGB8_ALPHA8:
		case COMPRESSEDTEXFORMAT_ASTC_10x6_SRGB8_ALPHA8:
		case COMPRESSEDTEXFORMAT_ASTC_10x8_SRGB8_ALPHA8:
		case COMPRESSEDTEXFORMAT_ASTC_10x10_SRGB8_ALPHA8:
		case COMPRESSEDTEXFORMAT_ASTC_12x10_SRGB8_ALPHA8:
		case COMPRESSEDTEXFORMAT_ASTC_12x12_SRGB8_ALPHA8:
			astc::decompress(dst, src, format, params.astcMode);
			break;

		default:
			DE_ASSERT(false);
			break;
	}
}